

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O3

int Cof_NodeDeref_rec(Cof_Obj_t *pNode)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  
  uVar1 = *(uint *)pNode;
  if ((uVar1 & 0xf0) == 0) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    do {
      uVar3 = (uVar1 >> 8) - 1;
      *(uint *)pNode = uVar1 & 0xff | uVar3 * 0x100;
      if ((uVar3 & 0xffffff) != 0) {
        return iVar5;
      }
      iVar2 = Cof_NodeDeref_rec((Cof_Obj_t *)
                                ((long)pNode + ((ulong)*(uint *)(pNode + 1) & 0x7fffffff) * -4));
      uVar4 = (ulong)pNode[1].nFanoutsM & 0x7fffffff;
      iVar5 = iVar5 + iVar2 + 1;
      uVar1 = *(uint *)((long)pNode + uVar4 * -4);
      pNode = (Cof_Obj_t *)((long)pNode + uVar4 * -4);
    } while ((uVar1 & 0xf0) != 0);
  }
  return iVar5;
}

Assistant:

int Cof_NodeDeref_rec( Cof_Obj_t * pNode )
{
    if ( pNode->nFanins == 0 )
        return 0;
    if ( --pNode->nFanouts > 0 )
        return 0;
    return 1 + Cof_NodeDeref_rec( Cof_ObjFanin(pNode, 0) )
             + Cof_NodeDeref_rec( Cof_ObjFanin(pNode, 1) );
}